

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall
fmt::internal::PrintfFormatter<wchar_t>::parse_flags
          (PrintfFormatter<wchar_t> *this,FormatSpec *spec,wchar_t **s)

{
  wchar_t wVar1;
  uint uVar2;
  wchar_t *pwVar3;
  
  uVar2 = spec->flags_;
  pwVar3 = *s;
  do {
    while( true ) {
      while( true ) {
        wVar1 = *pwVar3;
        if (wVar1 != L'-') break;
        (spec->super_AlignSpec).align_ = ALIGN_LEFT;
        pwVar3 = pwVar3 + 1;
      }
      if (wVar1 != L'0') break;
      (spec->super_AlignSpec).super_WidthSpec.fill_ = L'0';
      pwVar3 = pwVar3 + 1;
    }
    if (wVar1 == L' ') {
      uVar2 = uVar2 | 1;
    }
    else if (wVar1 == L'#') {
      uVar2 = uVar2 | 8;
    }
    else {
      if (wVar1 != L'+') {
        *s = pwVar3;
        return;
      }
      uVar2 = uVar2 | 3;
    }
    spec->flags_ = uVar2;
    pwVar3 = pwVar3 + 1;
  } while( true );
}

Assistant:

void fmt::internal::PrintfFormatter<Char>::parse_flags(
    FormatSpec &spec, const Char *&s) {
  for (;;) {
    switch (*s++) {
      case '-':
        spec.align_ = ALIGN_LEFT;
        break;
      case '+':
        spec.flags_ |= SIGN_FLAG | PLUS_FLAG;
        break;
      case '0':
        spec.fill_ = '0';
        break;
      case ' ':
        spec.flags_ |= SIGN_FLAG;
        break;
      case '#':
        spec.flags_ |= HASH_FLAG;
        break;
      default:
        --s;
        return;
    }
  }
}